

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

int32_t __thiscall fasttext::FastText::getLabelId(FastText *this,string *label)

{
  string_view w;
  int32_t iVar1;
  int32_t iVar2;
  element_type *this_00;
  Dictionary *this_01;
  string *in_RSI;
  int32_t labelId;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b8750);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  w._M_len._4_4_ = in_stack_ffffffffffffffec;
  w._M_len._0_4_ = in_stack_ffffffffffffffe8;
  w._M_str = (char *)in_RSI;
  iVar1 = Dictionary::getId(this_01,w);
  if (iVar1 != -1) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b8795);
    iVar2 = Dictionary::nwords(this_00);
    iVar1 = iVar1 - iVar2;
  }
  return iVar1;
}

Assistant:

int32_t FastText::getLabelId(const std::string& label) const {
  int32_t labelId = dict_->getId(label);
  if (labelId != -1) {
    labelId -= dict_->nwords();
  }
  return labelId;
}